

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.h
# Opt level: O0

cmCommand * __thiscall cmExportCommand::Clone(cmExportCommand *this)

{
  cmCommand *this_00;
  cmExportCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmExportCommand((cmExportCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmExportCommand; }